

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  long lVar4;
  int *piVar5;
  long lVar6;
  uchar *puVar7;
  ulong uVar8;
  stbi__result_info *in_R9;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  float *pfVar12;
  float fVar13;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar5 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar3 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar5,iVar1);
      if (pfVar3 != (float *)0x0) {
        uVar2 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar11 = b * a;
        lVar6 = (long)req_comp;
        uVar8 = (ulong)uVar11;
        if (0 < (int)uVar11) {
          uVar10 = 0;
          puVar7 = __ptr;
          pfVar12 = pfVar3;
          do {
            if (0 < (int)uVar2) {
              uVar9 = 0;
              do {
                fVar13 = powf((float)puVar7[uVar9] / 255.0,stbi__l2h_gamma);
                pfVar12[uVar9] = fVar13 * stbi__l2h_scale;
                uVar9 = uVar9 + 1;
              } while (uVar2 != uVar9);
            }
            uVar10 = uVar10 + 1;
            pfVar12 = pfVar12 + lVar6;
            puVar7 = puVar7 + lVar6;
          } while (uVar10 != uVar8);
        }
        if ((req_comp & 1U) == 0 && 0 < (int)uVar11) {
          lVar4 = (long)(int)uVar2;
          do {
            pfVar3[lVar4] = (float)__ptr[lVar4] / 255.0;
            lVar4 = lVar4 + lVar6;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar3 = (float *)0x0;
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if ((pfVar3 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar3,*x,*y,req_comp << 2);
    }
  }
  return pfVar3;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}